

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O1

void __thiscall SocketPP::TCPServer::onReceive(TCPServer *this,int fd,byte *buf,size_t len)

{
  byte *__dest;
  Message local_40;
  
  __dest = (byte *)0x0;
  local_40.rawMsg.len_ = 0;
  if (len != 0 && buf != (byte *)0x0) {
    __dest = (byte *)operator_new__(len);
    memcpy(__dest,buf,len);
    local_40.rawMsg.len_ = len;
  }
  local_40.target.fd = fd;
  local_40.rawMsg.data_ = __dest;
  if ((this->recvHandle_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->recvHandle_)._M_invoker)((_Any_data *)&this->recvHandle_,&local_40);
  }
  if (local_40.rawMsg.data_ != (byte *)0x0) {
    operator_delete__(local_40.rawMsg.data_);
  }
  return;
}

Assistant:

void TCPServer::onReceive(int fd, const byte* buf, size_t len) {
    TCPServer::onReceive(Message::create(fd, buf, len));
}